

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O3

void __thiscall wabt::WriteDebugName(wabt *this,Stream *stream,string_view name,char *desc)

{
  char *src;
  char *size;
  string_view local_30;
  
  local_30.size_ = (size_type)name.data_;
  local_30.data_ = (char *)stream;
  if ((char *)local_30.size_ == (char *)0x0) {
    size = (char *)0x0;
  }
  else {
    if (*(char *)&stream->_vptr_Stream != '$') {
      __assert_fail("stripped_name.front() == \'$\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/binary-writer.cc"
                    ,0x4d,"void wabt::WriteDebugName(Stream *, string_view, const char *)");
    }
    string_view::remove_prefix(&local_30,1);
    size = (char *)local_30.size_;
  }
  src = local_30.data_;
  WriteU32Leb128((Stream *)this,(uint32_t)size,"string length");
  Stream::WriteData((Stream *)this,src,(size_t)size,(char *)name.size_,Yes);
  return;
}

Assistant:

void WriteDebugName(Stream* stream, string_view name, const char* desc) {
  string_view stripped_name = name;
  if (!stripped_name.empty()) {
    // Strip leading $ from name
    assert(stripped_name.front() == '$');
    stripped_name.remove_prefix(1);
  }
  WriteStr(stream, stripped_name, desc, PrintChars::Yes);
}